

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativesum.cpp
# Opt level: O1

int __thiscall
ncnn::CumulativeSum::forward_inplace(CumulativeSum *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  ulong uVar15;
  float fVar16;
  
  uVar5 = bottom_top_blob->dims;
  if (uVar5 == 1) {
    iVar4 = bottom_top_blob->w;
    if (1 < (long)iVar4) {
      pfVar8 = (float *)bottom_top_blob->data;
      fVar16 = *pfVar8;
      lVar7 = 1;
      do {
        fVar16 = fVar16 + pfVar8[lVar7];
        pfVar8[lVar7] = fVar16;
        lVar7 = lVar7 + 1;
      } while (iVar4 != lVar7);
    }
  }
  else {
    iVar4 = (this->axis >> 0x1f & uVar5) + this->axis;
    if ((uVar5 == 2) && (iVar4 == 0)) {
      iVar4 = bottom_top_blob->h;
      if (1 < (long)iVar4) {
        uVar5 = bottom_top_blob->w;
        pfVar8 = (float *)bottom_top_blob->data;
        lVar7 = bottom_top_blob->elemsize * (long)(int)uVar5;
        lVar9 = 1;
        do {
          uVar12 = (ulong)uVar5;
          pfVar14 = pfVar8;
          if (0 < (int)uVar5) {
            do {
              *(float *)((long)pfVar14 + lVar7) = *pfVar14 + *(float *)((long)pfVar14 + lVar7);
              pfVar14 = pfVar14 + 1;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          lVar9 = lVar9 + 1;
          pfVar8 = (float *)((long)pfVar8 + lVar7);
        } while (lVar9 != iVar4);
      }
    }
    else if ((uVar5 == 2) && (iVar4 == 1)) {
      iVar4 = bottom_top_blob->h;
      if (0 < (long)iVar4) {
        uVar5 = bottom_top_blob->w;
        pvVar11 = bottom_top_blob->data;
        lVar7 = bottom_top_blob->elemsize * (long)(int)uVar5;
        lVar9 = 0;
        pvVar10 = pvVar11;
        do {
          if (1 < (int)uVar5) {
            fVar16 = *(float *)((long)pvVar11 + lVar7 * lVar9);
            uVar12 = 1;
            do {
              fVar16 = fVar16 + *(float *)((long)pvVar10 + uVar12 * 4);
              *(float *)((long)pvVar10 + uVar12 * 4) = fVar16;
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
          }
          lVar9 = lVar9 + 1;
          pvVar10 = (void *)((long)pvVar10 + lVar7);
        } while (lVar9 != iVar4);
      }
    }
    else {
      if ((uVar5 == 3) && (iVar4 == 0)) {
        iVar4 = bottom_top_blob->c;
        if (1 < (long)iVar4) {
          uVar5 = bottom_top_blob->h * bottom_top_blob->w;
          pfVar8 = (float *)bottom_top_blob->data;
          lVar7 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
          lVar9 = 1;
          do {
            uVar12 = (ulong)uVar5;
            pfVar14 = pfVar8;
            if (0 < (int)uVar5) {
              do {
                *(float *)((long)pfVar14 + lVar7) = *pfVar14 + *(float *)((long)pfVar14 + lVar7);
                pfVar14 = pfVar14 + 1;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
            }
            lVar9 = lVar9 + 1;
            pfVar8 = (float *)((long)pfVar8 + lVar7);
          } while (lVar9 != iVar4);
          return 0;
        }
        return 0;
      }
      if ((uVar5 == 3) && (iVar4 == 1)) {
        iVar4 = bottom_top_blob->c;
        if (0 < (long)iVar4) {
          uVar5 = bottom_top_blob->w;
          uVar1 = bottom_top_blob->h;
          pvVar11 = bottom_top_blob->data;
          sVar2 = bottom_top_blob->elemsize;
          lVar9 = (long)bottom_top_blob->w * sVar2;
          sVar3 = bottom_top_blob->cstep;
          lVar7 = 0;
          do {
            if (1 < (int)uVar1) {
              uVar12 = 1;
              pvVar10 = pvVar11;
              do {
                if (0 < (int)uVar5) {
                  uVar15 = 0;
                  do {
                    *(float *)((long)pvVar10 + uVar15 * 4 + lVar9) =
                         *(float *)((long)pvVar10 + uVar15 * 4) +
                         *(float *)((long)pvVar10 + uVar15 * 4 + lVar9);
                    uVar15 = uVar15 + 1;
                  } while (uVar5 != uVar15);
                }
                uVar12 = uVar12 + 1;
                pvVar10 = (void *)((long)pvVar10 + lVar9);
              } while (uVar12 != uVar1);
            }
            lVar7 = lVar7 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
          } while (lVar7 != iVar4);
          return 0;
        }
      }
      else {
        if (uVar5 != 3) {
          return -100;
        }
        if (iVar4 != 2) {
          return -100;
        }
        iVar4 = bottom_top_blob->c;
        if (0 < (long)iVar4) {
          uVar5 = bottom_top_blob->w;
          uVar1 = bottom_top_blob->h;
          pvVar11 = bottom_top_blob->data;
          lVar7 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
          lVar9 = (long)bottom_top_blob->w * bottom_top_blob->elemsize;
          lVar13 = 0;
          pvVar10 = pvVar11;
          do {
            if (0 < (int)uVar1) {
              uVar12 = 0;
              pvVar6 = pvVar10;
              do {
                if (1 < (int)uVar5) {
                  fVar16 = *(float *)((long)pvVar11 + lVar9 * uVar12 + lVar7 * lVar13);
                  uVar15 = 1;
                  do {
                    fVar16 = fVar16 + *(float *)((long)pvVar6 + uVar15 * 4);
                    *(float *)((long)pvVar6 + uVar15 * 4) = fVar16;
                    uVar15 = uVar15 + 1;
                  } while (uVar5 != uVar15);
                }
                uVar12 = uVar12 + 1;
                pvVar6 = (void *)((long)pvVar6 + lVar9);
              } while (uVar12 != uVar1);
            }
            lVar13 = lVar13 + 1;
            pvVar10 = (void *)((long)pvVar10 + lVar7);
          } while (lVar13 != iVar4);
          return 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int CumulativeSum::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1)
    {   // ignore axis
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        for (int i = 1; i < w; ++i)
        {
            ptr[i] = ptr[i] + ptr[i - 1];
        }

        return 0;
    } // if (dims == 1)

    if (dims == 2 && positive_axis == 0)
    {
        // sum over rows
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 1; i < h; ++i)
        {
            const float* prev_row = bottom_top_blob.row(i - 1);
            float* this_row = bottom_top_blob.row(i);

            for (int k = 0; k < w; ++k)
            {
                this_row[k] = this_row[k] + prev_row[k];
            }
        }

        return 0;
    } // if (dims == 2 && positive_axis == 0)

    if (dims == 2 && positive_axis == 1)
    {
        // sum over columns
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);

            for (int k = 1; k < w; ++k)
            {
                ptr[k] = ptr[k] + ptr[k - 1];
            }
        }

        return 0;
    } // if (dims == 2 && positive_axis == 1)

    if (dims == 3 && positive_axis == 0)
    {
        // sum over channels
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int c = bottom_top_blob.c;

        int size = w * h;

        for (int i = 1; i < c; ++i)
        {
            const float* prev = bottom_top_blob.channel(i - 1);
            float* cur = bottom_top_blob.channel(i);

            for (int k = 0; k < size; ++k)
            {
                cur[k] = cur[k] + prev[k];
            }
        }

        return 0;
    } // if (dims == 3 && positive_axis == 0)

    if (dims == 3 && positive_axis == 1)
    {
        // sum over rows within each channel

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int c = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat this_channel = bottom_top_blob.channel(q);

            for (int i = 1; i < h; ++i)
            {
                const float* prev_row = this_channel.row(i - 1);
                float* this_row = this_channel.row(i);

                for (int k = 0; k < w; ++k)
                {
                    this_row[k] = this_row[k] + prev_row[k];
                }
            }
        }

        return 0;
    } // if (dims == 3 && positive_axis == 1)

    if (dims == 3 && positive_axis == 2)
    {
        // sum over columns within each channel

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int c = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat this_channel = bottom_top_blob.channel(q);

            for (int i = 0; i < h; ++i)
            {
                float* ptr = this_channel.row(i);
                for (int k = 1; k < w; ++k)
                {
                    ptr[k] = ptr[k] + ptr[k - 1];
                }
            }
        }

        return 0;
    } // if (dims == 3 && positive_axis == 2)

    return -100;
}